

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

int CmdCommandSetVariable(Abc_Frame_t *pAbc,int argc,char **argv)

{
  st__table *table;
  int iVar1;
  char *key_00;
  FILE *pFVar2;
  char *local_50;
  char *pcStack_40;
  int c;
  char *key;
  char *value;
  char *flag_value;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  flag_value = (char *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argv_local._4_4_,(char **)flag_value,"h");
  if (((iVar1 == -1) && (argv_local._4_4_ != 0)) && (argv_local._4_4_ < 4)) {
    if (argv_local._4_4_ == 1) {
      CmdPrintTable(pAStack_18->tFlags,0);
      pAbc_local._4_4_ = 0;
    }
    else {
      pcStack_40 = *(char **)(flag_value + 8);
      iVar1 = st__delete(pAStack_18->tFlags,&stack0xffffffffffffffc0,&key);
      if (iVar1 != 0) {
        if (pcStack_40 != (char *)0x0) {
          free(pcStack_40);
          pcStack_40 = (char *)0x0;
        }
        if (key != (char *)0x0) {
          free(key);
          key = (char *)0x0;
        }
      }
      if (argv_local._4_4_ == 2) {
        local_50 = Extra_UtilStrsav("");
      }
      else {
        local_50 = Extra_UtilStrsav(*(char **)(flag_value + 0x10));
      }
      value = local_50;
      table = pAStack_18->tFlags;
      key_00 = Extra_UtilStrsav(*(char **)(flag_value + 8));
      st__insert(table,key_00,value);
      iVar1 = strcmp(*(char **)(flag_value + 8),"abcout");
      if (iVar1 == 0) {
        if (pAStack_18->Out != _stdout) {
          fclose((FILE *)pAStack_18->Out);
        }
        iVar1 = strcmp(value,"");
        if (iVar1 == 0) {
          value = "-";
        }
        pFVar2 = CmdFileOpen(pAStack_18,value,"w",(char **)0x0,0);
        pAStack_18->Out = pFVar2;
        if (pAStack_18->Out == (FILE *)0x0) {
          pAStack_18->Out = _stdout;
        }
      }
      iVar1 = strcmp(*(char **)(flag_value + 8),"abcerr");
      if (iVar1 == 0) {
        if (pAStack_18->Err != _stderr) {
          fclose((FILE *)pAStack_18->Err);
        }
        iVar1 = strcmp(value,"");
        if (iVar1 == 0) {
          value = "-";
        }
        pFVar2 = CmdFileOpen(pAStack_18,value,"w",(char **)0x0,0);
        pAStack_18->Err = pFVar2;
        if (pAStack_18->Err == (FILE *)0x0) {
          pAStack_18->Err = _stderr;
        }
      }
      iVar1 = strcmp(*(char **)(flag_value + 8),"history");
      if (iVar1 == 0) {
        if (pAStack_18->Hst != (FILE *)0x0) {
          fclose((FILE *)pAStack_18->Hst);
        }
        iVar1 = strcmp(value,"");
        if (iVar1 == 0) {
          pAStack_18->Hst = (FILE *)0x0;
        }
        else {
          pFVar2 = CmdFileOpen(pAStack_18,value,"w",(char **)0x0,0);
          pAStack_18->Hst = pFVar2;
          if (pAStack_18->Hst == (FILE *)0x0) {
            pAStack_18->Hst = (FILE *)0x0;
          }
        }
      }
      pAbc_local._4_4_ = 0;
    }
  }
  else {
    fprintf((FILE *)pAStack_18->Err,"usage: set [-h] <name> <value>\n");
    fprintf((FILE *)pAStack_18->Err,"\t        sets the value of parameter <name>\n");
    fprintf((FILE *)pAStack_18->Err,"\t-h    : print the command usage\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int CmdCommandSetVariable( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char *flag_value, *value;
    const char* key;
    int c;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc == 0 || argc > 3 )
    {
        goto usage;
    }
    else if ( argc == 1 )
    {
        CmdPrintTable( pAbc->tFlags, 0 );
        return 0;
    }
    else
    {
        key = argv[1];
        if ( st__delete( pAbc->tFlags, &key, &value ) )
        {
            ABC_FREE( key );
            ABC_FREE( value );
        }

        flag_value = argc == 2 ? Extra_UtilStrsav( "" ) : Extra_UtilStrsav( argv[2] );
//        flag_value = argc == 2 ? NULL : Extra_UtilStrsav(argv[2]);
        st__insert( pAbc->tFlags, Extra_UtilStrsav(argv[1]), flag_value );

        if ( strcmp( argv[1], "abcout" ) == 0 )
        {
            if ( pAbc->Out != stdout )
                fclose( pAbc->Out );
            if ( strcmp( flag_value, "" ) == 0 )
                flag_value = "-";
            pAbc->Out = CmdFileOpen( pAbc, flag_value, "w", NULL, 0 );
            if ( pAbc->Out == NULL )
                pAbc->Out = stdout;
#if HAVE_SETVBUF
            setvbuf( pAbc->Out, ( char * ) NULL, _IOLBF, 0 );
#endif
        }
        if ( strcmp( argv[1], "abcerr" ) == 0 )
        {
            if ( pAbc->Err != stderr )
                fclose( pAbc->Err );
            if ( strcmp( flag_value, "" ) == 0 )
                flag_value = "-";
            pAbc->Err = CmdFileOpen( pAbc, flag_value, "w", NULL, 0 );
            if ( pAbc->Err == NULL )
                pAbc->Err = stderr;
#if HAVE_SETVBUF
            setvbuf( pAbc->Err, ( char * ) NULL, _IOLBF, 0 );
#endif
        }
        if ( strcmp( argv[1], "history" ) == 0 )
        {
            if ( pAbc->Hst != NULL )
                fclose( pAbc->Hst );
            if ( strcmp( flag_value, "" ) == 0 )
                pAbc->Hst = NULL;
            else
            {
                pAbc->Hst = CmdFileOpen( pAbc, flag_value, "w", NULL, 0 );
                if ( pAbc->Hst == NULL )
                    pAbc->Hst = NULL;
            }
        }
        return 0;
    }

  usage:
    fprintf( pAbc->Err, "usage: set [-h] <name> <value>\n" );
    fprintf( pAbc->Err, "\t        sets the value of parameter <name>\n" );
    fprintf( pAbc->Err, "\t-h    : print the command usage\n" );
    return 1;

}